

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

int __thiscall console::init(console *this,EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  termios new_termios;
  
  advanced_display = SUB81(ctx,0);
  simple_io = SUB81(this,0);
  if ((int)this == 0) {
    tcgetattr(0,(termios *)initial_state);
    new_termios.c_iflag = initial_state._0_4_;
    new_termios.c_oflag = initial_state._4_4_;
    new_termios.c_cc[7] = initial_state[0x18];
    new_termios.c_cc[8] = initial_state[0x19];
    new_termios.c_cc[9] = initial_state[0x1a];
    new_termios.c_cc[10] = initial_state[0x1b];
    new_termios.c_cc[0xb] = initial_state[0x1c];
    new_termios.c_cc[0xc] = initial_state[0x1d];
    new_termios.c_cc[0xd] = initial_state[0x1e];
    new_termios.c_cc[0xe] = initial_state[0x1f];
    new_termios.c_cc[0xf] = initial_state[0x20];
    new_termios.c_cc[0x10] = initial_state[0x21];
    new_termios.c_cc[0x11] = initial_state[0x22];
    new_termios.c_cc[0x12] = initial_state[0x23];
    new_termios.c_cc[0x13] = initial_state[0x24];
    new_termios.c_cc[0x14] = initial_state[0x25];
    new_termios.c_cc[0x15] = initial_state[0x26];
    new_termios.c_cc[0x16] = initial_state[0x27];
    new_termios.c_cc[0x17] = initial_state[0x28];
    new_termios.c_cc[0x18] = initial_state[0x29];
    new_termios.c_cc[0x19] = initial_state[0x2a];
    new_termios.c_cc[0x1a] = initial_state[0x2b];
    new_termios.c_cc[0x1b] = initial_state[0x2c];
    new_termios.c_cc[0x1c] = initial_state[0x2d];
    new_termios.c_cc[0x1d] = initial_state[0x2e];
    new_termios.c_cc[0x1e] = initial_state[0x2f];
    new_termios._48_4_ = initial_state._48_4_;
    new_termios.c_ispeed = initial_state._52_4_;
    new_termios.c_ospeed = initial_state._56_4_;
    new_termios._8_8_ = initial_state._8_8_ & 0xfffffff5ffffffff;
    new_termios._16_6_ = SUB86(initial_state._16_8_,0);
    new_termios.c_cc[5] = '\0';
    new_termios.c_cc[6] = '\x01';
    tcsetattr(0,0,(termios *)&new_termios);
    tty = fopen("/dev/tty","w+");
    if (tty != (FILE *)0x0) {
      out = tty;
    }
  }
  pcVar1 = setlocale(6,"");
  return (int)pcVar1;
}

Assistant:

void init(bool use_simple_io, bool use_advanced_display) {
        advanced_display = use_advanced_display;
        simple_io = use_simple_io;
#if defined(_WIN32)
        // Windows-specific console initialization
        DWORD dwMode = 0;
        hConsole = GetStdHandle(STD_OUTPUT_HANDLE);
        if (hConsole == INVALID_HANDLE_VALUE || !GetConsoleMode(hConsole, &dwMode)) {
            hConsole = GetStdHandle(STD_ERROR_HANDLE);
            if (hConsole != INVALID_HANDLE_VALUE && (!GetConsoleMode(hConsole, &dwMode))) {
                hConsole = nullptr;
                simple_io = true;
            }
        }
        if (hConsole) {
            // Check conditions combined to reduce nesting
            if (advanced_display && !(dwMode & ENABLE_VIRTUAL_TERMINAL_PROCESSING) &&
                !SetConsoleMode(hConsole, dwMode | ENABLE_VIRTUAL_TERMINAL_PROCESSING)) {
                advanced_display = false;
            }
            // Set console output codepage to UTF8
            SetConsoleOutputCP(CP_UTF8);
        }
        HANDLE hConIn = GetStdHandle(STD_INPUT_HANDLE);
        if (hConIn != INVALID_HANDLE_VALUE && GetConsoleMode(hConIn, &dwMode)) {
            // Set console input codepage to UTF16
            _setmode(_fileno(stdin), _O_WTEXT);

            // Set ICANON (ENABLE_LINE_INPUT) and ECHO (ENABLE_ECHO_INPUT)
            if (simple_io) {
                dwMode |= ENABLE_LINE_INPUT | ENABLE_ECHO_INPUT;
            } else {
                dwMode &= ~(ENABLE_LINE_INPUT | ENABLE_ECHO_INPUT);
            }
            if (!SetConsoleMode(hConIn, dwMode)) {
                simple_io = true;
            }
        }
        if (simple_io) {
            _setmode(_fileno(stdin), _O_U8TEXT);
        }
#else
        // POSIX-specific console initialization
        if (!simple_io) {
            struct termios new_termios;
            tcgetattr(STDIN_FILENO, &initial_state);
            new_termios = initial_state;
            new_termios.c_lflag &= ~(ICANON | ECHO);
            new_termios.c_cc[VMIN] = 1;
            new_termios.c_cc[VTIME] = 0;
            tcsetattr(STDIN_FILENO, TCSANOW, &new_termios);

            tty = fopen("/dev/tty", "w+");
            if (tty != nullptr) {
                out = tty;
            }
        }

        setlocale(LC_ALL, "");
#endif
    }